

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

void __thiscall VulkanHppGenerator::checkCorrectness(VulkanHppGenerator *this)

{
  size_type sVar1;
  string local_40;
  
  sVar1 = (this->m_vulkanLicenseHeader)._M_string_length;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"missing license header","");
  checkForError(sVar1 != 0,-1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  checkBitmaskCorrectness(this);
  checkCommandCorrectness(this);
  checkDefineCorrectness(this);
  checkEnumCorrectness(this);
  checkExtensionCorrectness(this);
  checkFuncPointerCorrectness(this);
  checkHandleCorrectness(this);
  checkRequireCorrectness(this);
  checkSpirVCapabilityCorrectness(this);
  checkStructCorrectness(this);
  checkSyncAccessCorrectness(this);
  checkSyncStageCorrectness(this);
  return;
}

Assistant:

void VulkanHppGenerator::checkCorrectness() const
{
  checkForError( !m_vulkanLicenseHeader.empty(), -1, "missing license header" );
  checkBitmaskCorrectness();
  checkCommandCorrectness();
  checkDefineCorrectness();
  checkEnumCorrectness();
  checkExtensionCorrectness();
  checkFuncPointerCorrectness();
  checkHandleCorrectness();
  checkRequireCorrectness();
  checkSpirVCapabilityCorrectness();
  checkStructCorrectness();
  checkSyncAccessCorrectness();
  checkSyncStageCorrectness();
}